

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void SyncTest(void)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  __int_type _Var4;
  pointer pCVar5;
  ostream *poVar6;
  CWorker *this;
  float fVar7;
  type tStack_730;
  uint32_t nAvarageTime_1;
  duration<long,_std::ratio<1L,_1000000L>_> local_728;
  rep local_720;
  rep nUsCount_1;
  time_point tl2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_708;
  uint32_t n_3;
  time_point tl1;
  uint32_t n_2;
  uint32_t nMinTime_1;
  uint32_t nMaxTime_1;
  uint32_t nAverageTime_1;
  float fSingleThreadTime;
  uint32_t nAvarageTime;
  duration<long,_std::ratio<1L,_1000000L>_> local_6e0;
  rep local_6d8;
  rep nUsCount;
  time_point t2;
  uint32_t n_1;
  CChainController chainController;
  CSyncStartTask *pAddress;
  char data [1600];
  time_point t1;
  uint32_t n;
  uint32_t nMinTime;
  uint32_t nMaxTime;
  uint32_t nAverageTime;
  CWorker *currentWorker;
  __single_object pTaskManager;
  float fManagerTaskTime;
  uint32_t nTestCount;
  uint32_t nTaskPlanCount;
  uint32_t nEndTaskCount;
  uint32_t nMidTaskCount;
  uint32_t nStartTaskCount;
  memory_order __b_1;
  memory_order __b;
  
  pTaskManager._M_t.
  super___uniq_ptr_impl<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_>._M_t.
  super__Tuple_impl<0UL,_sftm::CTaskManager_*,_std::default_delete<sftm::CTaskManager>_>.
  super__Head_base<0UL,_sftm::CTaskManager_*,_false>._M_head_impl._4_4_ = 100;
  pTaskManager._M_t.
  super___uniq_ptr_impl<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_>._M_t.
  super__Tuple_impl<0UL,_sftm::CTaskManager_*,_std::default_delete<sftm::CTaskManager>_>.
  super__Head_base<0UL,_sftm::CTaskManager_*,_false>._M_head_impl._0_4_ = 0.0;
  std::make_unique<sftm::CTaskManager>();
  pCVar5 = std::unique_ptr<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_>::operator->
                     ((unique_ptr<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_> *)
                      &currentWorker);
  iVar2 = std::thread::hardware_concurrency();
  sftm::CTaskManager::Start(pCVar5,iVar2 - 1);
  poVar6 = std::operator<<((ostream *)&std::cout,"Sync manager started on ");
  pCVar5 = std::unique_ptr<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_>::operator->
                     ((unique_ptr<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_> *)
                      &currentWorker);
  uVar3 = sftm::CTaskManager::GetWorkersCount(pCVar5);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar3);
  std::operator<<(poVar6," threads\n");
  pCVar5 = std::unique_ptr<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_>::operator->
                     ((unique_ptr<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_> *)
                      &currentWorker);
  this = sftm::CTaskManager::GetMainWorker(pCVar5);
  poVar6 = std::operator<<((ostream *)&std::cout,"\tTests:\t\t\t");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,100);
  std::operator<<(poVar6,"\titerations\n");
  nMinTime = 0;
  n = 0;
  t1.__d.__r._4_4_ = 0xffffffff;
  for (t1.__d.__r._0_4_ = 0; (uint)t1.__d.__r < 100; t1.__d.__r._0_4_ = (uint)t1.__d.__r + 1) {
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    LOCK();
    UNLOCK();
    SyncTest::nExecutedTasks.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0
    ;
    data._1592_8_ = std::chrono::_V2::system_clock::now();
    sftm::CChainController::CChainController((CChainController *)((long)&t2.__d.__r + 4),100);
    for (t2.__d.__r._0_4_ = 0; (uint)t2.__d.__r < 100; t2.__d.__r._0_4_ = (uint)t2.__d.__r + 1) {
      SyncTest()::CSyncStartTask::CSyncStartTask(sftm::CChainController__
                ((CSyncStartTask *)&pAddress + (uint)t2.__d.__r,
                 (CChainController *)((long)&t2.__d.__r + 4));
    }
    sftm::CWorker::PushTask<SyncTest()::CSyncStartTask>(this,(CSyncStartTask *)&pAddress,100);
    sftm::CWorker::WorkUntil(this,(CChainController *)((long)&t2.__d.__r + 4));
    nUsCount = std::chrono::_V2::system_clock::now();
    _fSingleThreadTime =
         std::chrono::operator-
                   ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)&nUsCount,
                    (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)(data + 0x638));
    local_6e0.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)&fSingleThreadTime);
    local_6d8 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_6e0);
    _Var4 = std::__atomic_base::operator_cast_to_unsigned_int
                      ((__atomic_base *)&SyncTest::nExecutedTasks);
    if (_Var4 != 0xf69b4) {
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)t1.__d.__r);
      poVar6 = std::operator<<(poVar6,"\tPlanned: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xf69b4);
      poVar6 = std::operator<<(poVar6,"; Execued: ");
      _Var4 = std::__atomic_base::operator_cast_to_unsigned_int
                        ((__atomic_base *)&SyncTest::nExecutedTasks);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,_Var4);
      std::operator<<(poVar6,";\n");
    }
    uVar1 = (uint)local_6d8;
    nMinTime = nMinTime + uVar1;
    if ((long)(ulong)n < local_6d8) {
      n = uVar1;
    }
    if (local_6d8 < (long)(ulong)t1.__d.__r._4_4_) {
      t1.__d.__r._4_4_ = uVar1;
    }
    sftm::CChainController::~CChainController((CChainController *)((long)&t2.__d.__r + 4));
  }
  pTaskManager._M_t.
  super___uniq_ptr_impl<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_>._M_t.
  super__Tuple_impl<0UL,_sftm::CTaskManager_*,_std::default_delete<sftm::CTaskManager>_>.
  super__Head_base<0UL,_sftm::CTaskManager_*,_false>._M_head_impl._0_4_ =
       ((float)(nMinTime / 100) / 1.0101e+06) * 1000.0;
  poVar6 = std::operator<<((ostream *)&std::cout,"\tMax time:\t\t");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,n);
  std::operator<<(poVar6,"\tuS\n");
  poVar6 = std::operator<<((ostream *)&std::cout,"\tAvg time:\t\t");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,nMinTime / 100);
  std::operator<<(poVar6,"\tuS\n");
  poVar6 = std::operator<<((ostream *)&std::cout,"\tMin time:\t\t");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,t1.__d.__r._4_4_);
  std::operator<<(poVar6,"\tuS\n");
  poVar6 = std::operator<<((ostream *)&std::cout,"\tAvg time on task:\t");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     (poVar6,pTaskManager._M_t.
                             super___uniq_ptr_impl<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_sftm::CTaskManager_*,_std::default_delete<sftm::CTaskManager>_>
                             .super__Head_base<0UL,_sftm::CTaskManager_*,_false>._M_head_impl._0_4_)
  ;
  std::operator<<(poVar6,"\tnS\n");
  pCVar5 = std::unique_ptr<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_>::operator->
                     ((unique_ptr<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_> *)
                      &currentWorker);
  sftm::CTaskManager::Stop(pCVar5);
  std::unique_ptr<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_>::~unique_ptr
            ((unique_ptr<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_> *)
             &currentWorker);
  std::operator<<((ostream *)&std::cout,"\nSingle thread the same task start\n");
  poVar6 = std::operator<<((ostream *)&std::cout,"\tTests:\t\t\t");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,100);
  std::operator<<(poVar6,"\titerations\n");
  nMinTime_1 = 0;
  n_2 = 0;
  tl1.__d.__r._4_4_ = 0xffffffff;
  for (tl1.__d.__r._0_4_ = 0; (uint)tl1.__d.__r < 100; tl1.__d.__r._0_4_ = (uint)tl1.__d.__r + 1) {
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    LOCK();
    SyncTest()::nExecutedTasks.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)0;
    UNLOCK();
    tStack_708.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    for (tl2.__d.__r._4_4_ = 0; tl2.__d.__r._4_4_ < 0xf69b4;
        tl2.__d.__r._4_4_ = tl2.__d.__r._4_4_ + 1) {
      std::__atomic_base<unsigned_int>::operator++
                (&SyncTest()::nExecutedTasks.super___atomic_base<unsigned_int>);
    }
    nUsCount_1 = std::chrono::_V2::system_clock::now();
    tStack_730 = std::chrono::operator-
                           ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&nUsCount_1,&stack0xfffffffffffff8f8);
    local_728.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                        (&stack0xfffffffffffff8d0);
    local_720 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_728);
    uVar1 = (uint)local_720;
    nMinTime_1 = nMinTime_1 + uVar1;
    if ((long)(ulong)n_2 < local_720) {
      n_2 = uVar1;
    }
    if (local_720 < (long)(ulong)tl1.__d.__r._4_4_) {
      tl1.__d.__r._4_4_ = uVar1;
    }
  }
  fVar7 = ((float)(nMinTime_1 / 100) / 1.0101e+06) * 1000.0;
  poVar6 = std::operator<<((ostream *)&std::cout,"\tMax time:\t\t");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,n_2);
  std::operator<<(poVar6,"\tuS\n");
  poVar6 = std::operator<<((ostream *)&std::cout,"\tAvg time:\t\t");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,nMinTime_1 / 100);
  std::operator<<(poVar6,"\tuS\n");
  poVar6 = std::operator<<((ostream *)&std::cout,"\tMin time:\t\t");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,tl1.__d.__r._4_4_);
  std::operator<<(poVar6,"\tuS\n");
  poVar6 = std::operator<<((ostream *)&std::cout,"\tAvg time on task:\t");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,fVar7);
  std::operator<<(poVar6,"\tnS\n");
  poVar6 = std::operator<<((ostream *)&std::cout,"\t\n\tAverage task overhead:\t");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     (poVar6,pTaskManager._M_t.
                             super___uniq_ptr_impl<sftm::CTaskManager,_std::default_delete<sftm::CTaskManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_sftm::CTaskManager_*,_std::default_delete<sftm::CTaskManager>_>
                             .super__Head_base<0UL,_sftm::CTaskManager_*,_false>._M_head_impl._0_4_
                             - fVar7);
  std::operator<<(poVar6,"\tnS\n");
  return;
}

Assistant:

void SyncTest() noexcept
{
	constexpr std::uint32_t nStartTaskCount = 100;
	constexpr std::uint32_t nMidTaskCount	= 100;
	constexpr std::uint32_t nEndTaskCount	= 100;
	constexpr std::uint32_t nTaskPlanCount	= nStartTaskCount * nMidTaskCount * nEndTaskCount + nMidTaskCount * nEndTaskCount + nEndTaskCount;
	constexpr std::uint32_t nTestCount		= 100;

	float fManagerTaskTime = 0;
	{
		static std::atomic<std::uint32_t> nExecutedTasks = 0;

		class CSyncEndTask : public sftm::CTask
		{
		public:
			CSyncEndTask(sftm::CChainController& chainController) :sftm::CTask(chainController) {}
			virtual ~CSyncEndTask() {}

		public:
			virtual void Execute(sftm::CWorker& worker) noexcept override
			{
				nExecutedTasks++;
			}
		};
		class CSyncMidTask : public sftm::CTask
		{
		public:
			CSyncMidTask(sftm::CChainController& chainController) :sftm::CTask(chainController) {}
			virtual ~CSyncMidTask() {}

		public:
			virtual void Execute(sftm::CWorker& worker) noexcept override
			{
				STACK_MEMORY(CSyncEndTask, nEndTaskCount);
				sftm::CChainController chainController(nEndTaskCount);
				for (std::uint32_t n = 0; n < nEndTaskCount; n++)
					new(pAddress + n) CSyncEndTask(chainController);

				worker.PushTask(pAddress, nEndTaskCount);
				worker.WorkUntil(chainController);

				nExecutedTasks++;
			}
		};
		class CSyncStartTask : public sftm::CTask
		{
		public:
			CSyncStartTask(sftm::CChainController& chainController) :sftm::CTask(chainController) {}
			virtual ~CSyncStartTask() {}

		public:
			virtual void Execute(sftm::CWorker& worker) noexcept override
			{
				STACK_MEMORY(CSyncMidTask, nMidTaskCount);
				sftm::CChainController chainController(nMidTaskCount);
				for (std::uint32_t n = 0; n < nMidTaskCount; ++n)
					new(pAddress + n) CSyncMidTask(chainController);

				worker.PushTask(pAddress, nMidTaskCount);
				worker.WorkUntil(chainController);

				nExecutedTasks++;
			}
		};

		auto pTaskManager(std::make_unique<sftm::CTaskManager>());
		
		pTaskManager->Start(std::thread::hardware_concurrency() - 1);
		std::cout << "Sync manager started on " << pTaskManager->GetWorkersCount() << " threads\n";

		auto& currentWorker = pTaskManager->GetMainWorker();

		std::cout << "	Tests:			" << nTestCount << "	iterations\n";

		std::uint32_t nAverageTime = 0, nMaxTime = 0, nMinTime = 0xFFFFFFFF;

		for (std::uint32_t n = 0; n < nTestCount; ++n)
		{
			nExecutedTasks.store(0);

			auto t1 = std::chrono::high_resolution_clock::now();

			STACK_MEMORY(CSyncStartTask, nStartTaskCount);
			sftm::CChainController chainController(nStartTaskCount);
			for (std::uint32_t n = 0; n < nStartTaskCount; ++n)
				new(pAddress + n) CSyncStartTask(chainController);

			currentWorker.PushTask(pAddress, nStartTaskCount);
			currentWorker.WorkUntil(chainController);

			auto t2 = std::chrono::high_resolution_clock::now();
			auto nUsCount = std::chrono::duration_cast<std::chrono::microseconds>(t2 - t1).count();
			if(nTaskPlanCount != nExecutedTasks)
				std::cout << n << "	Planned: " << nTaskPlanCount << "; Execued: " << nExecutedTasks << ";\n";

			nAverageTime += nUsCount;
			if (nMaxTime < nUsCount)
				nMaxTime = nUsCount;
			if (nMinTime > nUsCount)
				nMinTime = nUsCount;
		}

		auto nAvarageTime		= nAverageTime / nTestCount;
		fManagerTaskTime = (float)nAvarageTime / (float)nTaskPlanCount * 1000.0f;
		std::cout << "	Max time:		"		<< nMaxTime				<<	"	uS\n";
		std::cout << "	Avg time:		"		<< nAvarageTime			<<	"	uS\n";
		std::cout << "	Min time:		"		<< nMinTime				<<	"	uS\n";
		std::cout << "	Avg time on task:	"	<< fManagerTaskTime		<< "	nS\n";
	
		pTaskManager->Stop();
	}

	float fSingleThreadTime = 0;
	{
		std::cout << "\nSingle thread the same task start\n";

		std::cout << "	Tests:			" << nTestCount << "	iterations\n";

		static std::atomic<std::uint32_t> nExecutedTasks = 0;
		std::uint32_t nAverageTime = 0, nMaxTime = 0, nMinTime = 0xFFFFFFFF;

		for (std::uint32_t n = 0; n < nTestCount; ++n)
		{
			nExecutedTasks.store(0);

			auto tl1 = std::chrono::high_resolution_clock::now();

			for (std::uint32_t n = 0; n < nTaskPlanCount; ++n)
				++nExecutedTasks;

			auto tl2 = std::chrono::high_resolution_clock::now();
			auto nUsCount = std::chrono::duration_cast<std::chrono::microseconds>(tl2 - tl1).count();

			nAverageTime += nUsCount;
			if (nMaxTime < nUsCount)
				nMaxTime = nUsCount;
			if (nMinTime > nUsCount)
				nMinTime = nUsCount;
		}

		auto nAvarageTime = nAverageTime / nTestCount;
		fSingleThreadTime = (float)nAvarageTime / (float)nTaskPlanCount * 1000.0f;
		std::cout << "	Max time:		"		<< nMaxTime				<< "	uS\n";
		std::cout << "	Avg time:		"		<< nAvarageTime			<< "	uS\n";
		std::cout << "	Min time:		"		<< nMinTime				<< "	uS\n";
		std::cout << "	Avg time on task:	"	<< fSingleThreadTime	<< "	nS\n";
	}

	std::cout << "	\n	Average task overhead:	" << fManagerTaskTime - fSingleThreadTime <<"	nS\n";

}